

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O2

int __thiscall
Fl_Text_Buffer::findchar_backward(Fl_Text_Buffer *this,int startPos,uint searchChar,int *foundPos)

{
  uint uVar1;
  int iVar2;
  
  if (startPos < 1) {
LAB_001cbdf9:
    iVar2 = 0;
    startPos = 0;
  }
  else {
    if (this->mLength < startPos) {
      startPos = this->mLength;
    }
    iVar2 = 1;
    do {
      startPos = prev_char(this,startPos);
      if (startPos < 0) goto LAB_001cbdf9;
      uVar1 = char_at(this,startPos);
    } while (uVar1 != searchChar);
  }
  *foundPos = startPos;
  return iVar2;
}

Assistant:

int Fl_Text_Buffer::findchar_backward(int startPos, unsigned int searchChar,
				      int *foundPos) const {
  if (startPos <= 0) {
    *foundPos = 0;
    return 0;
  }
  
  if (startPos > mLength)
    startPos = mLength;
  
  for (startPos = prev_char(startPos); startPos>=0; startPos = prev_char(startPos)) {
    if (searchChar == char_at(startPos)) {
      *foundPos = startPos;
      return 1;
    }
  }
  
  *foundPos = 0;
  return 0;
}